

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::ReduceMinLayerParams::_InternalParse
          (ReduceMinLayerParams *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  uint64_t uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint uVar3;
  char cVar4;
  uint32_t tag;
  char *local_48;
  uint local_3c;
  InternalMetadata *local_38;
  
  local_38 = &(this->super_MessageLite)._internal_metadata_;
  local_48 = ptr;
  do {
    while( true ) {
      bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_48);
      if (bVar1) {
        return local_48;
      }
      local_48 = google::protobuf::internal::ReadTag(local_48,&local_3c,0);
      tag_00 = local_3c;
      uVar3 = local_3c >> 3;
      cVar4 = (char)local_3c;
      if (uVar3 != 3) break;
      if (cVar4 != '\x18') goto LAB_0021718f;
      uVar2 = google::protobuf::internal::ReadVarint64(&local_48);
      this->reduceall_ = uVar2 != 0;
LAB_00217164:
      if (local_48 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    if (uVar3 == 2) {
      if (cVar4 == '\x10') {
        uVar2 = google::protobuf::internal::ReadVarint64(&local_48);
        this->keepdims_ = uVar2 != 0;
        goto LAB_00217164;
      }
LAB_0021718f:
      if ((local_3c == 0) || ((local_3c & 7) == 4)) {
        if (local_48 == (char *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
        return local_48;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>(local_38);
      local_48 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_48,ctx);
    }
    else {
      if (uVar3 != 1) goto LAB_0021718f;
      if (cVar4 != '\n') {
        if ((local_3c & 0xff) == 8) {
          uVar2 = google::protobuf::internal::ReadVarint64(&local_48);
          _internal_add_axes(this,uVar2);
          goto LAB_00217164;
        }
        goto LAB_0021718f;
      }
      local_48 = google::protobuf::internal::PackedInt64Parser(&this->axes_,local_48,ctx);
    }
    if (local_48 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* ReduceMinLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated int64 axes = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt64Parser(_internal_mutable_axes(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 8) {
          _internal_add_axes(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool keepDims = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          keepdims_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool reduceAll = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 24)) {
          reduceall_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}